

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileTimeCompare(string *f1,string *f2,int *result)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_148 [8];
  stat s2;
  stat s1;
  int *result_local;
  string *f2_local;
  string *f1_local;
  
  *result = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(pcVar2,(stat64 *)(s2.__glibc_reserved + 2));
  if (iVar1 == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = stat64(pcVar2,(stat64 *)local_148);
    if (iVar1 == 0) {
      if (s1.st_atim.tv_nsec < s2.st_atim.tv_nsec) {
        *result = -1;
      }
      else if (s2.st_atim.tv_nsec < s1.st_atim.tv_nsec) {
        *result = 1;
      }
      else if (s1.st_mtim.tv_sec < s2.st_mtim.tv_sec) {
        *result = -1;
      }
      else if (s2.st_mtim.tv_sec < s1.st_mtim.tv_sec) {
        *result = 1;
      }
      f1_local._7_1_ = true;
    }
    else {
      f1_local._7_1_ = false;
    }
  }
  else {
    f1_local._7_1_ = false;
  }
  return f1_local._7_1_;
}

Assistant:

bool SystemTools::FileTimeCompare(const std::string& f1,
                                  const std::string& f2,
                                  int* result)
{
  // Default to same time.
  *result = 0;
#if !defined(_WIN32) || defined(__CYGWIN__)
  // POSIX version.  Use stat function to get file modification time.
  struct stat s1;
  if(stat(f1.c_str(), &s1) != 0)
    {
    return false;
    }
  struct stat s2;
  if(stat(f2.c_str(), &s2) != 0)
    {
    return false;
    }
# if KWSYS_CXX_STAT_HAS_ST_MTIM
  // Compare using nanosecond resolution.
  if(s1.st_mtim.tv_sec < s2.st_mtim.tv_sec)
    {
    *result = -1;
    }
  else if(s1.st_mtim.tv_sec > s2.st_mtim.tv_sec)
    {
    *result = 1;
    }
  else if(s1.st_mtim.tv_nsec < s2.st_mtim.tv_nsec)
    {
    *result = -1;
    }
  else if(s1.st_mtim.tv_nsec > s2.st_mtim.tv_nsec)
    {
    *result = 1;
    }
# elif KWSYS_CXX_STAT_HAS_ST_MTIMESPEC
  // Compare using nanosecond resolution.
  if(s1.st_mtimespec.tv_sec < s2.st_mtimespec.tv_sec)
    {
    *result = -1;
    }
  else if(s1.st_mtimespec.tv_sec > s2.st_mtimespec.tv_sec)
    {
    *result = 1;
    }
  else if(s1.st_mtimespec.tv_nsec < s2.st_mtimespec.tv_nsec)
    {
    *result = -1;
    }
  else if(s1.st_mtimespec.tv_nsec > s2.st_mtimespec.tv_nsec)
    {
    *result = 1;
    }
# else
  // Compare using 1 second resolution.
  if(s1.st_mtime < s2.st_mtime)
    {
    *result = -1;
    }
  else if(s1.st_mtime > s2.st_mtime)
    {
    *result = 1;
    }
# endif
#else
  // Windows version.  Get the modification time from extended file attributes.
  WIN32_FILE_ATTRIBUTE_DATA f1d;
  WIN32_FILE_ATTRIBUTE_DATA f2d;
  if(!GetFileAttributesExW(
       SystemTools::ConvertToWindowsExtendedPath(f1).c_str(),
       GetFileExInfoStandard, &f1d))
    {
    return false;
    }
  if(!GetFileAttributesExW(
       SystemTools::ConvertToWindowsExtendedPath(f2).c_str(),
       GetFileExInfoStandard, &f2d))
    {
    return false;
    }

  // Compare the file times using resolution provided by system call.
  *result = (int)CompareFileTime(&f1d.ftLastWriteTime, &f2d.ftLastWriteTime);
#endif
  return true;
}